

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane::IfcCurveBoundedPlane(IfcCurveBoundedPlane *this)

{
  IfcCurveBoundedPlane *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x78,"IfcCurveBoundedPlane");
  IfcBoundedSurface::IfcBoundedSurface
            (&this->super_IfcBoundedSurface,&PTR_construction_vtable_24__00fc7b70);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane,_3UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane,_3UL> *)
             &(this->super_IfcBoundedSurface).super_IfcSurface.field_0x40,
             &PTR_construction_vtable_24__00fc7c20);
  (this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfc7a90;
  *(undefined8 *)&this->field_0x78 = 0xfc7b58;
  *(undefined8 *)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfc7ab8;
  *(undefined8 *)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfc7ae0;
  *(undefined8 *)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.field_0x30
       = 0xfc7b08;
  *(undefined8 *)&(this->super_IfcBoundedSurface).super_IfcSurface.field_0x40 = 0xfc7b30;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPlane>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcPlane> *)&(this->super_IfcBoundedSurface).field_0x50,
             (LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::Lazy(&this->OuterBoundary,(LazyObject *)0x0);
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_0UL,_0UL>::ListOf
            (&this->InnerBoundaries);
  return;
}

Assistant:

IfcCurveBoundedPlane() : Object("IfcCurveBoundedPlane") {}